

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deUniquePtr.hpp
# Opt level: O0

void __thiscall
de::details::UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>::reset
          (UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_> *this)

{
  UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_> *this_local;
  
  if ((this->m_data).ptr != (BufferWithMemory *)0x0) {
    DefaultDeleter<vk::BufferWithMemory>::operator()
              ((DefaultDeleter<vk::BufferWithMemory> *)&(this->m_data).field_0x8,(this->m_data).ptr)
    ;
    (this->m_data).ptr = (BufferWithMemory *)0x0;
  }
  return;
}

Assistant:

void UniqueBase<T, D>::reset (void)
{
	if (m_data.ptr != DE_NULL)
	{
		m_data.deleter(m_data.ptr);
		m_data.ptr = DE_NULL;
	}
}